

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp3_fast_iVar5(uint *pInOut,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = (long)(start + -1);
  iVar1 = 0;
  do {
    if (lVar2 < finish) {
      start = 0;
LAB_0048a398:
      *pDifStart = start;
      return iVar1;
    }
    iVar3 = -(uint)(pInOut[lVar2 - iQ] < pInOut[lVar2 - jQ]);
    if (pInOut[lVar2 - jQ] < pInOut[lVar2 - iQ]) {
      iVar3 = 1;
    }
    if (iVar3 != 0) {
      iVar1 = 0;
      if (iVar3 != -1) {
        iVar1 = 1;
      }
      goto LAB_0048a398;
    }
    lVar2 = lVar2 + -4;
    start = start + -4;
  } while( true );
}

Assistant:

int minTemp3_fast_iVar5(unsigned* pInOut, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp3_fast_iVar5\n");

    for(i=start-1; i>=finish; i-=4) 
    {
        temp = CompareWords(pInOut[i-iQ],pInOut[i-jQ]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 1;
        }
    }
    *pDifStart=0;
    return 0;
}